

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_colormap(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_color_quantizer *pjVar2;
  jpeg_error_mgr *pjVar3;
  JDIMENSION JVar4;
  int iVar5;
  int iVar6;
  JSAMPARRAY ppJVar7;
  int *_mp;
  int local_40;
  int val;
  int ptr;
  int blkdist;
  int blksize;
  int nci;
  int k;
  int j;
  int i;
  int total_colors;
  JSAMPARRAY colormap;
  my_cquantize_ptr cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->cquantize;
  JVar4 = select_ncolors(cinfo,(int *)((long)&pjVar2[1].new_color_map + 4));
  if (cinfo->out_color_components == 3) {
    pjVar3 = cinfo->err;
    (pjVar3->msg_parm).i[0] = JVar4;
    (pjVar3->msg_parm).i[1] = *(int *)((long)&pjVar2[1].new_color_map + 4);
    (pjVar3->msg_parm).i[2] = *(int *)&pjVar2[2].start_pass;
    (pjVar3->msg_parm).i[3] = *(int *)((long)&pjVar2[2].start_pass + 4);
    cinfo->err->msg_code = 0x60;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  }
  else {
    cinfo->err->msg_code = 0x61;
    (cinfo->err->msg_parm).i[0] = JVar4;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  }
  ppJVar7 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar4,cinfo->out_color_components);
  val = JVar4;
  for (k = 0; k < cinfo->out_color_components; k = k + 1) {
    iVar1 = *(int *)((long)&pjVar2[1].new_color_map + (long)k * 4 + 4);
    iVar5 = val / iVar1;
    for (nci = 0; nci < iVar1; nci = nci + 1) {
      iVar6 = output_value(cinfo,k,nci,iVar1 + -1);
      for (local_40 = nci * iVar5; local_40 < (int)JVar4; local_40 = val + local_40) {
        for (blksize = 0; blksize < iVar5; blksize = blksize + 1) {
          ppJVar7[k][local_40 + blksize] = (JSAMPLE)iVar6;
        }
      }
    }
    val = iVar5;
  }
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar7;
  *(JDIMENSION *)&pjVar2[1].color_quantize = JVar4;
  return;
}

Assistant:

LOCAL(void)
create_colormap (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  JSAMPARRAY colormap;		/* Created colormap */
  int total_colors;		/* Number of distinct output colors */
  int i,j,k, nci, blksize, blkdist, ptr, val;

  /* Select number of colors for each component */
  total_colors = select_ncolors(cinfo, cquantize->Ncolors);

  /* Report selected color counts */
  if (cinfo->out_color_components == 3)
    TRACEMS4(cinfo, 1, JTRC_QUANT_3_NCOLORS,
	     total_colors, cquantize->Ncolors[0],
	     cquantize->Ncolors[1], cquantize->Ncolors[2]);
  else
    TRACEMS1(cinfo, 1, JTRC_QUANT_NCOLORS, total_colors);

  /* Allocate and fill in the colormap. */
  /* The colors are ordered in the map in standard row-major order, */
  /* i.e. rightmost (highest-indexed) color changes most rapidly. */

  colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr) cinfo, JPOOL_IMAGE,
     (JDIMENSION) total_colors, (JDIMENSION) cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  /* blkdist is distance between groups of identical entries for a component */
  blkdist = total_colors;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colormap entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blkdist / nci;
    for (j = 0; j < nci; j++) {
      /* Compute j'th output value (out of nci) for component */
      val = output_value(cinfo, i, j, nci-1);
      /* Fill in all colormap entries that have this value of this component */
      for (ptr = j * blksize; ptr < total_colors; ptr += blkdist) {
	/* fill in blksize entries beginning at ptr */
	for (k = 0; k < blksize; k++)
	  colormap[i][ptr+k] = (JSAMPLE) val;
      }
    }
    blkdist = blksize;		/* blksize of this color is blkdist of next */
  }

  /* Save the colormap in private storage,
   * where it will survive color quantization mode changes.
   */
  cquantize->sv_colormap = colormap;
  cquantize->sv_actual = total_colors;
}